

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

void Assimp::IFC::FindBorderContours(iterator current)

{
  pointer paVar1;
  double dVar2;
  pointer paVar3;
  pointer paVar4;
  bool bVar5;
  byte bVar6;
  long lVar7;
  IfcVector2 *proj_point;
  double dVar8;
  double dVar9;
  double dVar10;
  reference rVar11;
  
  paVar3 = ((current._M_current)->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar4 = ((current._M_current)->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar8 = 0.0;
  lVar7 = 0;
  bVar6 = 0;
  bVar5 = false;
  dVar10 = 0.0;
  do {
    paVar1 = (pointer)((long)&paVar3->x + lVar7);
    if (paVar1 == paVar4) {
      if (((bool)(bVar5 & bVar6)) &&
         (ABS((paVar3->y - dVar8) * (paVar3->x - dVar10)) < 1.1920928955078125e-07)) {
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&(current._M_current)->skiplist,
                            ((ulong)((current._M_current)->skiplist).
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                    _M_offset +
                            ((long)((current._M_current)->skiplist).
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                            - (long)((current._M_current)->skiplist).
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                            * 8) - 1);
        *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
      }
      return;
    }
    dVar9 = paVar1->x;
    if ((((dVar9 <= 0.0001) || (0.9999 <= dVar9)) ||
        (dVar2 = *(double *)((long)&paVar3->y + lVar7), dVar2 <= 0.0001)) || (0.9999 <= dVar2)) {
      if (bVar5) {
        if (lVar7 == 0) {
          __assert_fail("cit != cbegin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                        ,0x315,"void Assimp::IFC::FindBorderContours(ContourVector::iterator)");
        }
        bVar5 = true;
        if (ABS((*(double *)((long)&paVar3->y + lVar7) - dVar8) * (dVar9 - dVar10)) <
            1.1920928955078125e-07) {
          rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&(current._M_current)->skiplist,(lVar7 >> 4) - 1);
          *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
          dVar9 = paVar1->x;
        }
      }
      else {
        bVar6 = bVar6 | lVar7 == 0;
        bVar5 = true;
      }
    }
    else {
      bVar5 = false;
    }
    dVar8 = *(double *)((long)&paVar3->y + lVar7);
    lVar7 = lVar7 + 0x10;
    dVar10 = dVar9;
  } while( true );
}

Assistant:

void FindBorderContours(ContourVector::iterator current)
{
    const IfcFloat border_epsilon_upper = static_cast<IfcFloat>(1-1e-4);
    const IfcFloat border_epsilon_lower = static_cast<IfcFloat>(1e-4);

    bool outer_border = false;
    bool start_on_outer_border = false;

    SkipList& skiplist = (*current).skiplist;
    IfcVector2 last_proj_point;

    const Contour::const_iterator cbegin = (*current).contour.begin(), cend = (*current).contour.end();

    for (Contour::const_iterator cit = cbegin; cit != cend; ++cit) {
        const IfcVector2& proj_point = *cit;

        // Check if this connection is along the outer boundary of the projection
        // plane. In such a case we better drop it because such 'edges' should
        // not have any geometry to close them (think of door openings).
        if (proj_point.x <= border_epsilon_lower || proj_point.x >= border_epsilon_upper ||
            proj_point.y <= border_epsilon_lower || proj_point.y >= border_epsilon_upper) {

                if (outer_border) {
                    ai_assert(cit != cbegin);
                    if (LikelyBorder(proj_point - last_proj_point)) {
                        skiplist[std::distance(cbegin, cit) - 1] = true;
                    }
                }
                else if (cit == cbegin) {
                    start_on_outer_border = true;
                }

                outer_border = true;
        }
        else {
            outer_border = false;
        }

        last_proj_point = proj_point;
    }

    // handle last segment
    if (outer_border && start_on_outer_border) {
        const IfcVector2& proj_point = *cbegin;
        if (LikelyBorder(proj_point - last_proj_point)) {
            skiplist[skiplist.size()-1] = true;
        }
    }
}